

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeLDR(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint RegNo;
  
  RegNo = Val >> 0x10 & 0xf;
  DVar2 = DecodeGPRnopcRegisterClass(Inst,Val >> 0xc & 0xf,Address,Decoder);
  if (DVar2 == MCDisassembler_Fail) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
      bVar1 = false;
    }
  }
  if (bVar1) {
    DVar2 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_00,Decoder);
    if (DVar2 == MCDisassembler_Fail) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
        bVar1 = false;
      }
    }
    if (bVar1) {
      Decoder_00 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[RegNo]);
      DVar2 = DecodePostIdxReg(Inst,Val >> 0x13 & 0x10 | Val & 0xf,Address_01,Decoder_00);
      if (DVar2 == MCDisassembler_Fail) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        DVar2 = DecodePredicateOperand(Inst,Val >> 0x1c,Address_02,Decoder_00);
        DVar2 = (*(code *)(&DAT_001d467c + *(int *)(&DAT_001d467c + (ulong)DVar2 * 4)))();
        return DVar2;
      }
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeLDR(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Cond;
	unsigned Rn = fieldFromInstruction_4(Val, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	Rm |= (fieldFromInstruction_4(Val, 23, 1) << 4);
	Cond = fieldFromInstruction_4(Val, 28, 4);

	if (fieldFromInstruction_4(Val, 8, 4) != 0 || Rn == Rt)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrMode7Operand(Inst, Rn, Address, Decoder))) 
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePostIdxReg(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, Cond, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}